

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O3

int update_local_initial_window_size_func(void *entry,void *ptr)

{
  int iVar1;
  int iVar2;
  
  iVar1 = nghttp2_stream_update_local_initial_window_size
                    ((nghttp2_stream *)entry,*(int32_t *)((long)ptr + 8),
                     *(int32_t *)((long)ptr + 0xc));
  if (iVar1 == 0) {
    iVar1 = 0;
    if (*(char *)((long)entry + 0xdb) == '\0') {
      if (((*ptr)->opt_flags & 1) == 0) {
        iVar2 = nghttp2_should_send_window_update
                          (*(int32_t *)((long)entry + 0xbc),*(int32_t *)((long)entry + 0xb0));
        iVar1 = 0;
        if ((iVar2 != 0) &&
           (iVar1 = nghttp2_session_add_window_update
                              (*ptr,'\0',*(int32_t *)((long)entry + 0xa8),
                               *(int32_t *)((long)entry + 0xb0)), iVar1 == 0)) {
          *(undefined4 *)((long)entry + 0xb0) = 0;
          iVar1 = 0;
        }
      }
      else {
        iVar1 = session_update_consumed_size
                          (*ptr,(int32_t *)((long)entry + 0xb4),(int32_t *)((long)entry + 0xb0),'\0'
                           ,*(int32_t *)((long)entry + 0xa8),0,*(int32_t *)((long)entry + 0xbc));
      }
    }
    return iVar1;
  }
  iVar1 = nghttp2_session_add_rst_stream(*ptr,*(int32_t *)((long)entry + 0xa8),3);
  return iVar1;
}

Assistant:

static int update_local_initial_window_size_func(void *entry, void *ptr) {
  int rv;
  nghttp2_update_window_size_arg *arg;
  nghttp2_stream *stream;
  arg = (nghttp2_update_window_size_arg *)ptr;
  stream = (nghttp2_stream *)entry;
  rv = nghttp2_stream_update_local_initial_window_size(
    stream, arg->new_window_size, arg->old_window_size);
  if (rv != 0) {
    return nghttp2_session_add_rst_stream(arg->session, stream->stream_id,
                                          NGHTTP2_FLOW_CONTROL_ERROR);
  }

  if (stream->window_update_queued) {
    return 0;
  }

  if (arg->session->opt_flags & NGHTTP2_OPTMASK_NO_AUTO_WINDOW_UPDATE) {
    return session_update_stream_consumed_size(arg->session, stream, 0);
  }

  if (nghttp2_should_send_window_update(stream->local_window_size,
                                        stream->recv_window_size)) {
    rv = nghttp2_session_add_window_update(arg->session, NGHTTP2_FLAG_NONE,
                                           stream->stream_id,
                                           stream->recv_window_size);
    if (rv != 0) {
      return rv;
    }

    stream->recv_window_size = 0;
  }
  return 0;
}